

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall Token::Token(Token *this,ObjectStoreToken *inToken)

{
  byte bVar1;
  Mutex *pMVar2;
  void *pvVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ByteString userPINBlob;
  ByteString soPINBlob;
  byte local_7a;
  MutexFactory *in_stack_ffffffffffffff90;
  undefined1 local_60 [16];
  ByteString *in_stack_ffffffffffffffb0;
  ByteString *in_stack_ffffffffffffffb8;
  SecureDataManager *in_stack_ffffffffffffffc0;
  undefined1 local_38 [40];
  undefined8 local_10;
  
  *in_RDI = &PTR__Token_00223d88;
  local_10 = in_RSI;
  MutexFactory::i();
  pMVar2 = MutexFactory::getMutex(in_stack_ffffffffffffff90);
  in_RDI[4] = pMVar2;
  in_RDI[2] = local_10;
  ByteString::ByteString((ByteString *)0x1ecca7);
  ByteString::ByteString((ByteString *)0x1eccb1);
  bVar1 = (**(code **)(*(long *)in_RDI[2] + 8))((long *)in_RDI[2],local_38);
  local_7a = 0;
  if ((bVar1 & 1) != 0) {
    local_7a = (**(code **)(*(long *)in_RDI[2] + 0x18))((long *)in_RDI[2],local_60);
  }
  *(byte *)(in_RDI + 1) = local_7a & 1;
  pvVar3 = operator_new(0xd0);
  SecureDataManager::SecureDataManager
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  in_RDI[3] = pvVar3;
  ByteString::~ByteString((ByteString *)0x1ecd53);
  ByteString::~ByteString((ByteString *)0x1ecd5d);
  return;
}

Assistant:

Token::Token(ObjectStoreToken* inToken)
{
	tokenMutex = MutexFactory::i()->getMutex();

	token = inToken;

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	sdm = new SecureDataManager(soPINBlob, userPINBlob);
}